

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLKinematicsIntermediateData.h
# Opt level: O3

void __thiscall
COLLADASaxFWL::KinematicsInstanceKinematicsScene::addBindJointAxis
          (KinematicsInstanceKinematicsScene *this,KinematicsBindJointAxis *bindJointAxis)

{
  pointer *pppKVar1;
  iterator __position;
  KinematicsBindJointAxis *local_8;
  
  __position._M_current =
       (this->mBindJointAxes).
       super__Vector_base<COLLADASaxFWL::KinematicsBindJointAxis_*,_std::allocator<COLLADASaxFWL::KinematicsBindJointAxis_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->mBindJointAxes).
      super__Vector_base<COLLADASaxFWL::KinematicsBindJointAxis_*,_std::allocator<COLLADASaxFWL::KinematicsBindJointAxis_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_8 = bindJointAxis;
    std::
    vector<COLLADASaxFWL::KinematicsBindJointAxis*,std::allocator<COLLADASaxFWL::KinematicsBindJointAxis*>>
    ::_M_realloc_insert<COLLADASaxFWL::KinematicsBindJointAxis*const&>
              ((vector<COLLADASaxFWL::KinematicsBindJointAxis*,std::allocator<COLLADASaxFWL::KinematicsBindJointAxis*>>
                *)&this->mBindJointAxes,__position,&local_8);
  }
  else {
    *__position._M_current = bindJointAxis;
    pppKVar1 = &(this->mBindJointAxes).
                super__Vector_base<COLLADASaxFWL::KinematicsBindJointAxis_*,_std::allocator<COLLADASaxFWL::KinematicsBindJointAxis_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppKVar1 = *pppKVar1 + 1;
  }
  return;
}

Assistant:

void addBindJointAxis(KinematicsBindJointAxis* bindJointAxis) { mBindJointAxes.push_back(bindJointAxis);}